

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

void __thiscall S2Polygon::Shape::Init(Shape *this,S2Polygon *polygon)

{
  undefined1 *puVar1;
  pointer puVar2;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> _Var3;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  
  this->polygon_ = polygon;
  if (this->cumulative_edges_ != (int *)0x0) {
    operator_delete__(this->cumulative_edges_);
  }
  this->cumulative_edges_ = (int *)0x0;
  *(undefined4 *)&(this->super_S2Shape).field_0xc = 0;
  puVar2 = (polygon->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(polygon->loops_).
                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if ((((uVar4 & 0x7fffffff8) != 8) ||
      (_Var3._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
       super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
            (puVar2->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
      *(int *)((long)_Var3._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                     super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0xc) != 1)) ||
     ((*(byte *)((long)_Var3._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                       super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x1a) & 1) == 0)) {
    uVar6 = (uint)(uVar4 >> 3);
    if (0xc < (int)uVar6) {
      piVar5 = (int *)operator_new__(uVar4 >> 1 & 0x1fffffffc);
      this->cumulative_edges_ = piVar5;
    }
    if (0 < (int)uVar6) {
      piVar5 = this->cumulative_edges_;
      uVar4 = 0;
      do {
        if (piVar5 != (int *)0x0) {
          piVar5[uVar4] = *(int *)&(this->super_S2Shape).field_0xc;
        }
        puVar1 = &(this->super_S2Shape).field_0xc;
        *(int *)puVar1 =
             *(int *)puVar1 +
             *(int *)((long)puVar2[uVar4]._M_t.
                            super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t + 0xc);
        uVar4 = uVar4 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar4);
    }
  }
  return;
}

Assistant:

void S2Polygon::Shape::Init(const S2Polygon* polygon) {
  polygon_ = polygon;
  delete[] cumulative_edges_;
  cumulative_edges_ = nullptr;
  num_edges_ = 0;
  if (!polygon->is_full()) {
    const int kMaxLinearSearchLoops = 12;  // From benchmarks.
    int num_loops = polygon->num_loops();
    if (num_loops > kMaxLinearSearchLoops) {
      cumulative_edges_ = new int[num_loops];
    }
    for (int i = 0; i < num_loops; ++i) {
      if (cumulative_edges_) cumulative_edges_[i] = num_edges_;
      num_edges_ += polygon->loop(i)->num_vertices();
    }
  }
}